

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int initiate_socket_connection(SOCKET_IO_INSTANCE *socket_io_instance)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  LOGGER_LOG p_Var4;
  size_t __n;
  int *piVar5;
  undefined8 in_stack_ffffffffffffff08;
  char *pcVar6;
  undefined4 uVar7;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t hostname_len;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  sockaddr_un addrInfoUn;
  addrinfo *addr;
  int flags;
  int result;
  SOCKET_IO_INSTANCE *socket_io_instance_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  addrInfoUn.sun_path[100] = '\0';
  addrInfoUn.sun_path[0x65] = '\0';
  addrInfoUn.sun_path[0x66] = '\0';
  addrInfoUn.sun_path[0x67] = '\0';
  addrInfoUn.sun_path[0x68] = '\0';
  addrInfoUn.sun_path[0x69] = '\0';
  addrInfoUn.sun_path[0x6a] = '\0';
  addrInfoUn.sun_path[0x6b] = '\0';
  if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
    _Var1 = dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver);
    if (_Var1) {
      addrInfoUn.sun_path._100_8_ = dns_resolver_get_addrInfo(socket_io_instance->dns_resolver);
      if ((addrinfo *)addrInfoUn.sun_path._100_8_ == (addrinfo *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar6 = socket_io_instance->hostname;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"initiate_socket_connection",0x216,1,"DNS resolution failed. Hostname:%s",
                    pcVar6);
          uVar7 = (undefined4)((ulong)pcVar6 >> 0x20);
        }
        addr._4_4_ = 0x217;
      }
      else {
        addr._4_4_ = 0;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar6 = socket_io_instance->hostname;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"initiate_socket_connection",0x20d,1,
                  "DNS did not resolve hostname IP address. Hostname:%s",pcVar6);
        uVar7 = (undefined4)((ulong)pcVar6 >> 0x20);
      }
      addr._4_4_ = 0x20e;
    }
  }
  else if (socket_io_instance->hostname == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                ,"initiate_socket_connection",0x234,1,"Hostname is NULL");
    }
    addr._4_4_ = 0x235;
  }
  else {
    __n = strlen(socket_io_instance->hostname);
    if (__n + 1 < 0x6d) {
      memset((void *)((long)&l + 2),0,0x6e);
      l._2_2_ = 1;
      memcpy((void *)((long)&l + 4),socket_io_instance->hostname,__n);
      addr._4_4_ = 0;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar6 = socket_io_instance->hostname;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"initiate_socket_connection",0x226,1,
                  "Hostname %s is too long for a unix socket (max len = %lu)",pcVar6,0x6c);
        uVar7 = (undefined4)((ulong)pcVar6 >> 0x20);
      }
      addr._4_4_ = 0x227;
    }
  }
  if (addr._4_4_ == 0) {
    if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
      iVar2 = socket(*(int *)(addrInfoUn.sun_path._100_8_ + 4),
                     *(int *)(addrInfoUn.sun_path._100_8_ + 8),
                     *(int *)(addrInfoUn.sun_path._100_8_ + 0xc));
      socket_io_instance->socket = iVar2;
    }
    else {
      iVar2 = socket(1,1,0);
      socket_io_instance->socket = iVar2;
    }
    if (socket_io_instance->socket < 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"initiate_socket_connection",0x246,1,"Failure: socket create failure %d.",
                  CONCAT44(uVar7,socket_io_instance->socket));
      }
      addr._4_4_ = 0x247;
    }
    else if ((socket_io_instance->target_mac_address == (char *)0x0) ||
            (iVar2 = set_target_network_interface
                               (socket_io_instance->socket,socket_io_instance->target_mac_address),
            iVar2 == 0)) {
      uVar3 = fcntl(socket_io_instance->socket,3,0);
      if ((uVar3 == 0xffffffff) ||
         (iVar2 = fcntl(socket_io_instance->socket,4,(ulong)(uVar3 | 0x800)), iVar2 == -1)) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"initiate_socket_connection",0x254,1,"Failure: fcntl failure.");
        }
        addr._4_4_ = 0x255;
      }
      else {
        if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
          addr._4_4_ = connect(socket_io_instance->socket,
                               *(sockaddr **)(addrInfoUn.sun_path._100_8_ + 0x18),
                               *(socklen_t *)(addrInfoUn.sun_path._100_8_ + 0x10));
        }
        else {
          addr._4_4_ = connect(socket_io_instance->socket,(sockaddr *)((long)&l + 2),0x6e);
        }
        if ((addr._4_4_ == 0) || (piVar5 = __errno_location(), *piVar5 == 0x73)) {
          addr._4_4_ = 0;
          if (socket_io_instance->on_io_open_complete != (ON_IO_OPEN_COMPLETE)0x0) {
            (*socket_io_instance->on_io_open_complete)
                      (socket_io_instance->on_io_open_complete_context,IO_OPEN_OK);
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            piVar5 = __errno_location();
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                      ,"initiate_socket_connection",0x264,1,"Failure: connect failure %d.",
                      CONCAT44(uVar7,*piVar5));
          }
          addr._4_4_ = 0x265;
        }
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"initiate_socket_connection",0x24d,1,
                  "Failure: failed selecting target network interface (MACADDR=%s).",
                  socket_io_instance->target_mac_address);
      }
      addr._4_4_ = 0x24e;
    }
    if (addr._4_4_ != 0) {
      if (-1 < socket_io_instance->socket) {
        close(socket_io_instance->socket);
      }
      socket_io_instance->socket = -1;
    }
  }
  return addr._4_4_;
}

Assistant:

static int initiate_socket_connection(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result;
    int flags;
    struct addrinfo* addr = NULL;
    struct sockaddr_un addrInfoUn;

    if(socket_io_instance->address_type == ADDRESS_TYPE_IP)
    {
        if(!dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver))
        {
            LogError("DNS did not resolve hostname IP address. Hostname:%s", socket_io_instance->hostname);
            result = MU_FAILURE;
        }
        else
        {
            addr = dns_resolver_get_addrInfo(socket_io_instance->dns_resolver);

            if (addr == NULL)
            {
                LogError("DNS resolution failed. Hostname:%s", socket_io_instance->hostname);
                result = MU_FAILURE;
            } 
            else 
            {
                result = 0;
            }
        }
    }
    else
    {
        if (socket_io_instance->hostname != NULL)
        {
            size_t hostname_len = strlen(socket_io_instance->hostname);
            if (hostname_len + 1 > sizeof(addrInfoUn.sun_path))
            {
                LogError("Hostname %s is too long for a unix socket (max len = %lu)", socket_io_instance->hostname, (unsigned long)sizeof(addrInfoUn.sun_path));
                result = MU_FAILURE;
            }
            else
            {
                memset(&addrInfoUn, 0, sizeof(addrInfoUn));
                addrInfoUn.sun_family = AF_UNIX;
                // No need to add NULL terminator due to the above memset
                (void)memcpy(addrInfoUn.sun_path, socket_io_instance->hostname, hostname_len);
                result = 0;
            }
        }
        else
        {
            LogError("Hostname is NULL");
            result = MU_FAILURE;
        }
    }

    if(result == 0)
    {
        if (socket_io_instance->address_type == ADDRESS_TYPE_IP)
        {
            socket_io_instance->socket = socket(addr->ai_family, addr->ai_socktype, addr->ai_protocol);
        }
        else
        {
            socket_io_instance->socket = socket(AF_UNIX, SOCK_STREAM, 0);
        }

        if (socket_io_instance->socket < SOCKET_SUCCESS)
        {
            LogError("Failure: socket create failure %d.", socket_io_instance->socket);
            result = MU_FAILURE;
        }
        #ifndef __APPLE__
        else if (socket_io_instance->target_mac_address != NULL &&
                    set_target_network_interface(socket_io_instance->socket, socket_io_instance->target_mac_address) != 0)
        {
            LogError("Failure: failed selecting target network interface (MACADDR=%s).", socket_io_instance->target_mac_address);
            result = MU_FAILURE;
        }
        #endif //__APPLE__
        else if ((-1 == (flags = fcntl(socket_io_instance->socket, F_GETFL, 0))) ||
            (fcntl(socket_io_instance->socket, F_SETFL, flags | O_NONBLOCK) == -1))
        {
            LogError("Failure: fcntl failure.");
            result = MU_FAILURE;
        }
        else
        {
            if (socket_io_instance->address_type == ADDRESS_TYPE_IP)
            {
                result = connect(socket_io_instance->socket, addr->ai_addr, addr->ai_addrlen);
            }
            else
            {
                result = connect(socket_io_instance->socket, (struct sockaddr *)&addrInfoUn, sizeof(addrInfoUn));
            }

            if ((result != 0) && (errno != EINPROGRESS))
            {
                LogError("Failure: connect failure %d.", errno);
                result = MU_FAILURE;
            }
            else  // result == 0 || errno == EINPROGRESS
            {
                // Async connect will return -1.
                result = 0;
                if (socket_io_instance->on_io_open_complete != NULL)
                {
                    socket_io_instance->on_io_open_complete(socket_io_instance->on_io_open_complete_context, IO_OPEN_OK /*: IO_OPEN_ERROR*/);
                }
            }
        }

        if (result != 0)
        {
            if (socket_io_instance->socket >= SOCKET_SUCCESS)
            {
                close(socket_io_instance->socket);
            }
            socket_io_instance->socket = INVALID_SOCKET;
        }
    }

    return result;
}